

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint8_t *puVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  float fVar9;
  uint uVar10;
  float fVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  ushort uVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  
  if ((decode->chunk).height < 1) {
    return 0;
  }
  pvVar16 = decode->unpacked_buffer;
  uVar15 = 0;
  do {
    iVar8 = 5;
    if (0 < decode->channel_count) {
      iVar2 = (decode->chunk).start_y;
      peVar4 = decode->channels;
      lVar20 = 0;
      do {
        puVar5 = peVar4[lVar20].field_12.decode_to_ptr;
        iVar3 = peVar4[lVar20].width;
        uVar12 = peVar4[lVar20].y_samples;
        iVar14 = (int)peVar4[lVar20].bytes_per_element;
        lVar19 = (long)peVar4[lVar20].user_pixel_stride;
        if ((int)uVar12 < 2) {
          if (puVar5 == (uint8_t *)0x0) {
            pvVar16 = (void *)((long)pvVar16 + (long)(iVar14 * iVar3));
            iVar8 = 7;
          }
          else {
            lVar13 = (long)peVar4[lVar20].user_line_stride * uVar15;
LAB_0012864c:
            pfVar18 = (float *)(puVar5 + lVar13);
            uVar1 = peVar4[lVar20].data_type;
            iVar8 = 1;
            if (uVar1 == 0) {
              uVar1 = peVar4[lVar20].user_data_type;
              if (uVar1 == 2) {
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    *pfVar18 = (float)*(uint *)((long)pvVar16 + lVar13 * 4);
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
              else if (uVar1 == 1) {
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    uVar12 = *(uint *)((long)pvVar16 + lVar13 * 4);
                    uVar17 = 0x7c00;
                    if (uVar12 < 0xffe1) {
                      fVar11 = (float)(int)uVar12;
                      if ((uint)fVar11 < 0x38800000) {
                        if ((uint)fVar11 < 0x33000001) {
                          uVar17 = 0;
                        }
                        else {
                          uVar12 = (uint)fVar11 & 0x7fffff | 0x800000;
                          cVar7 = (char)((uint)fVar11 >> 0x17);
                          uVar17 = (ushort)(uVar12 >> (0x7eU - cVar7 & 0x1f));
                          if (0x80000000 < uVar12 << (cVar7 + 0xa2U & 0x1f)) {
                            uVar17 = uVar17 + 1;
                          }
                        }
                      }
                      else if ((uint)fVar11 < 0x7f800000) {
                        if ((uint)fVar11 < 0x477ff000) {
                          uVar17 = (ushort)((int)fVar11 + 0x8000fff +
                                            (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
                        }
                      }
                      else if (fVar11 != INFINITY) {
                        uVar12 = (uint)fVar11 >> 0xd & 0x3ff;
                        uVar17 = (ushort)(uVar12 == 0) | (ushort)uVar12 | 0x7c00;
                      }
                    }
                    *(ushort *)pfVar18 = uVar17;
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
              else {
                if (uVar1 != 0) goto LAB_00128adb;
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    *pfVar18 = *(float *)((long)pvVar16 + lVar13 * 4);
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
            }
            else if (uVar1 == 2) {
              uVar1 = peVar4[lVar20].user_data_type;
              if (uVar1 == 2) {
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    *pfVar18 = *(float *)((long)pvVar16 + lVar13 * 4);
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
              else if (uVar1 == 1) {
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    uVar12 = *(uint *)((long)pvVar16 + lVar13 * 4);
                    uVar10 = uVar12 & 0x7fffffff;
                    uVar17 = (ushort)(uVar12 >> 0x10) & 0x8000;
                    if (uVar10 < 0x38800000) {
                      if ((0x33000000 < uVar10) &&
                         (uVar12 = uVar12 & 0x7fffff | 0x800000, cVar7 = (char)(uVar10 >> 0x17),
                         uVar17 = uVar17 | (ushort)(uVar12 >> (0x7eU - cVar7 & 0x1f)),
                         0x80000000 < uVar12 << (cVar7 + 0xa2U & 0x1f))) {
                        uVar17 = uVar17 + 1;
                      }
                    }
                    else if (uVar10 < 0x7f800000) {
                      if (uVar10 < 0x477ff000) {
                        uVar17 = (ushort)(uVar10 + 0x8000fff + (uint)((uVar10 >> 0xd & 1) != 0) >>
                                         0xd) | uVar17;
                      }
                      else {
                        uVar17 = uVar17 | 0x7c00;
                      }
                    }
                    else {
                      uVar17 = uVar17 | 0x7c00;
                      if (uVar10 != 0x7f800000) {
                        uVar12 = uVar10 >> 0xd & 0x3ff;
                        uVar17 = uVar17 | (ushort)uVar12 | (ushort)(uVar12 == 0);
                      }
                    }
                    *(ushort *)pfVar18 = uVar17;
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
              else {
                if (uVar1 != 0) goto LAB_00128adb;
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    fVar11 = *(float *)((long)pvVar16 + lVar13 * 4);
                    fVar9 = 0.0;
                    if (0.0 <= fVar11) {
                      fVar9 = (float)(long)fVar11;
                      if (ABS(fVar11) == INFINITY) {
                        fVar9 = -NAN;
                      }
                      if (4.2949673e+09 < fVar11) {
                        fVar9 = -NAN;
                      }
                    }
                    *pfVar18 = fVar9;
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
            }
            else {
              if (uVar1 != 1) goto LAB_00128adb;
              uVar1 = peVar4[lVar20].user_data_type;
              if (uVar1 == 2) {
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    uVar12 = (uint)*(short *)((long)pvVar16 + lVar13 * 2);
                    uVar10 = (uVar12 & 0x7fff) << 0xd;
                    fVar11 = (float)(uVar12 & 0x80000000);
                    if (uVar10 < 0x800000) {
                      if ((uVar12 & 0x7fff) != 0) {
                        uVar6 = 0x1f;
                        if ((uVar12 & 0x7fff) != 0) {
                          for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                          }
                        }
                        iVar8 = (uVar6 ^ 0x1f) - 8;
                        fVar11 = (float)(((uint)fVar11 | uVar10 << ((byte)iVar8 & 0x1f) | 0x38800000
                                         ) + iVar8 * -0x800000);
                      }
                    }
                    else if (uVar10 < 0xf800000) {
                      fVar11 = (float)(((uint)fVar11 | uVar10) + 0x38000000);
                    }
                    else {
                      fVar11 = (float)((uint)fVar11 | uVar10 | 0x7f800000);
                    }
                    *pfVar18 = fVar11;
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
              else if (uVar1 == 1) {
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    *(ushort *)pfVar18 = *(ushort *)((long)pvVar16 + lVar13 * 2);
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
              else {
                if (uVar1 != 0) goto LAB_00128adb;
                if (0 < iVar3) {
                  lVar13 = 0;
                  do {
                    uVar17 = *(ushort *)((long)pvVar16 + lVar13 * 2);
                    uVar12 = (uint)uVar17;
                    if ((short)uVar17 < 0) {
                      fVar11 = 0.0;
                    }
                    else if ((~uVar12 & 0x7c00) == 0) {
                      fVar11 = (float)-(uint)((uVar17 & 0x3ff) == 0);
                    }
                    else {
                      uVar10 = uVar12 * 0x2000;
                      if (uVar12 < 0x400) {
                        if (uVar17 == 0) {
                          fVar11 = 0.0;
                        }
                        else {
                          uVar6 = 0x1f;
                          if (uVar12 != 0) {
                            for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                            }
                          }
                          iVar8 = (uVar6 ^ 0x1f) - 8;
                          fVar11 = (float)((uVar10 << ((byte)iVar8 & 0x1f) | 0x38800000) +
                                          iVar8 * -0x800000);
                        }
                      }
                      else if (uVar12 < 0x7c00) {
                        fVar11 = (float)(uVar10 + 0x38000000);
                      }
                      else {
                        fVar11 = (float)(uVar10 | 0x7f800000);
                      }
                      fVar11 = (float)(long)fVar11;
                    }
                    *pfVar18 = fVar11;
                    pfVar18 = (float *)((long)pfVar18 + lVar19);
                    lVar13 = lVar13 + 1;
                  } while (iVar3 != (int)lVar13);
                }
              }
            }
            pvVar16 = (void *)((long)pvVar16 + (long)(iVar3 * iVar14));
            iVar8 = 0;
          }
        }
        else {
          iVar8 = 7;
          if ((iVar2 + (int)uVar15) % (int)uVar12 == 0) {
            if (puVar5 != (uint8_t *)0x0) {
              lVar13 = (long)peVar4[lVar20].user_line_stride *
                       ((uVar15 & 0xffffffff) / (ulong)uVar12);
              goto LAB_0012864c;
            }
            pvVar16 = (void *)((long)pvVar16 + (long)(iVar14 * iVar3));
          }
        }
LAB_00128adb:
        if ((iVar8 != 7) && (iVar8 != 0)) goto LAB_00128afa;
        lVar20 = lVar20 + 1;
      } while (lVar20 < decode->channel_count);
      iVar8 = 5;
    }
LAB_00128afa:
    if ((iVar8 != 5) && (iVar8 != 0)) {
      return 3;
    }
    uVar15 = uVar15 + 1;
    if ((long)(decode->chunk).height <= (long)uVar15) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, bpc, ubpc;

    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (cdata)
                    cdata +=
                        ((uint64_t) (y / decc->y_samples) *
                         (uint64_t) decc->user_line_stride);
                else
                {
                    srcbuffer += w * bpc;
                    continue;
                }
            }
            else if (cdata)
            {
                cdata += ((uint64_t) y) * ((uint64_t) decc->user_line_stride);
            }
            else
            {
                srcbuffer += w * bpc;
                continue;
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}